

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value_bit_vector * bsim::unknown_bv(int len)

{
  int in_ESI;
  quad_value_bit_vector *in_RDI;
  string *in_stack_00000010;
  int in_stack_0000001c;
  int i;
  string str;
  int local_48;
  allocator local_31;
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  for (local_48 = 0; local_48 < local_c; local_48 = local_48 + 1) {
    std::__cxx11::string::operator+=(local_30,"x");
  }
  quad_value_bit_vector::quad_value_bit_vector(_i,in_stack_0000001c,in_stack_00000010);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static inline quad_value_bit_vector unknown_bv(const int len) {
    std::string str = "";
    for (int i = 0; i < len; i++) {
      str += "x";
    }
    return quad_value_bit_vector(len, str);
  }